

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O0

REF_STATUS ref_subdiv_mark_n(REF_SUBDIV ref_subdiv,REF_INT *n)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT part;
  REF_INT edge;
  REF_INT *n_local;
  REF_SUBDIV ref_subdiv_local;
  
  *n = 0;
  ref_private_macro_code_rss = 0;
  _part = n;
  n_local = (REF_INT *)ref_subdiv;
  do {
    if (**(int **)(n_local + 2) <= ref_private_macro_code_rss) {
      ref_subdiv_local._4_4_ = ref_mpi_allsum((REF_MPI)**(undefined8 **)n_local,_part,1,1);
      if (ref_subdiv_local._4_4_ == 0) {
        ref_subdiv_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               199,"ref_subdiv_mark_n",(ulong)ref_subdiv_local._4_4_,"allsum");
      }
      return ref_subdiv_local._4_4_;
    }
    if (*(int *)(*(long *)(n_local + 4) + (long)ref_private_macro_code_rss * 4) != 0) {
      uVar1 = ref_edge_part(*(REF_EDGE *)(n_local + 2),ref_private_macro_code_rss,
                            &ref_private_macro_code_rss_1);
      if (uVar1 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
               0xc4,"ref_subdiv_mark_n",(ulong)uVar1,"edge part");
        return uVar1;
      }
      if (ref_private_macro_code_rss_1 == *(int *)(**(long **)n_local + 4)) {
        *_part = *_part + 1;
      }
    }
    ref_private_macro_code_rss = ref_private_macro_code_rss + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_subdiv_mark_n(REF_SUBDIV ref_subdiv, REF_INT *n) {
  REF_INT edge, part;

  *n = 0;
  for (edge = 0; edge < ref_edge_n(ref_subdiv_edge(ref_subdiv)); edge++)
    if (0 != ref_subdiv_mark(ref_subdiv, edge)) {
      RSS(ref_edge_part(ref_subdiv_edge(ref_subdiv), edge, &part), "edge part")
      if (part == ref_mpi_rank(ref_subdiv_mpi(ref_subdiv))) (*n)++;
    }
  RSS(ref_mpi_allsum(ref_subdiv_mpi(ref_subdiv), n, 1, REF_INT_TYPE), "allsum");

  return REF_SUCCESS;
}